

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall
dgPolyhedra::MarkAdjacentCoplanarFaces
          (dgPolyhedra *this,dgPolyhedra *polyhedraOut,dgEdge *face,HaF64 *pool,HaI32 strideInBytes)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  dgEdge *face_00;
  double dVar8;
  double dVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  dgEdge *pdVar23;
  dgEdge *pdVar24;
  int iVar25;
  dgEdge *pdVar26;
  dgPolyhedra *this_00;
  uint uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  double dVar43;
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  dgBigVector normal1;
  HaI32 faceIndex [4096];
  dgEdge *deleteEdge [4096];
  dgEdge *stack [4096];
  int iStack_1414c;
  int iStack_1413c;
  double dStack_14130;
  double dStack_14128;
  double dStack_14118;
  double dStack_14110;
  undefined1 auStack_14108 [16];
  undefined1 auStack_140f8 [16];
  undefined1 auStack_140c8 [16];
  undefined1 auStack_140b8 [64];
  undefined1 auStack_14078 [16];
  double dStack_14068;
  double dStack_14060;
  undefined1 auStack_14058 [16];
  double dStack_14048;
  double dStack_14040;
  HaI32 aHStack_14038 [4096];
  dgEdge *apdStack_10038 [4096];
  dgEdge *local_8038 [4097];
  
  apdStack_10038[0] = face;
  if (face->m_incidentFace < 1) {
    __assert_fail("face->m_incidentFace > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xc36,
                  "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                 );
  }
  FaceNormal((dgBigVector *)auStack_14058,polyhedraOut,face,pool,strideInBytes);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dStack_14048;
  uVar27 = 1;
  dVar8 = auStack_14058._0_8_;
  auVar29._0_8_ = dVar8 * dVar8;
  dVar9 = auStack_14058._8_8_;
  auVar29._8_8_ = dVar9 * dVar9;
  auVar29 = vshufpd_avx(auVar29,auVar29,1);
  auVar29 = vfmadd231sd_fma(auVar29,auStack_14058,auStack_14058);
  auVar29 = vfmadd231sd_fma(auVar29,auVar30,auVar30);
  if (auVar29._0_8_ <= 9.999999960041972e-13) {
LAB_0085d800:
    uVar28 = 0;
    do {
      DeleteFace(this,apdStack_10038[uVar28]);
      uVar28 = uVar28 + 1;
    } while (uVar27 != uVar28);
    return;
  }
  auVar29 = vsqrtsd_avx(auVar29,auVar29);
  dVar33 = 1.0 / auVar29._0_8_;
  auVar50._0_8_ = dVar8 * dVar33;
  auVar50._8_8_ = dVar9 * dVar33;
  dVar33 = dStack_14048 * dVar33;
  auVar36._8_8_ = dStack_14040;
  auVar36._0_8_ = dStack_14040;
  auVar36._16_8_ = dStack_14040;
  auVar36._24_8_ = dStack_14040;
  auVar42._8_8_ = dVar33;
  auVar42._0_8_ = dVar33;
  auVar42._16_8_ = dVar33;
  auVar42._24_8_ = dVar33;
  auVar32 = vblendpd_avx(ZEXT1632(auVar50),auVar42,4);
  auVar32 = vblendpd_avx(auVar32,auVar36,8);
  auVar31._8_8_ = 0x7fffffffffffffff;
  auVar31._0_8_ = 0x7fffffffffffffff;
  auVar31._16_8_ = 0x7fffffffffffffff;
  auVar31._24_8_ = 0x7fffffffffffffff;
  auVar31 = vandpd_avx512vl(auVar32,auVar31);
  auVar32._8_8_ = 0x7fefffffffffffff;
  auVar32._0_8_ = 0x7fefffffffffffff;
  auVar32._16_8_ = 0x7fefffffffffffff;
  auVar32._24_8_ = 0x7fefffffffffffff;
  uVar28 = vpcmpgtq_avx512vl(auVar31,auVar32);
  if ((uVar28 & 0xf) != 0) {
LAB_0085d852:
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
  }
  lVar22 = (long)face->m_incidentVertex * (long)(strideInBytes >> 3);
  dStack_14110 = (double)pool[lVar22];
  if ((ulong)ABS(dStack_14110) < 0x7ff0000000000000) {
    auStack_140b8._0_16_ = *(undefined1 (*) [16])(pool + lVar22 + 1);
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    auVar29 = vpandq_avx512vl(auStack_140b8._0_16_,auVar11);
    auVar12._8_8_ = 0x7fefffffffffffff;
    auVar12._0_8_ = 0x7fefffffffffffff;
    uVar28 = vpcmpgtq_avx512vl(auVar29,auVar12);
    if (((((uVar28 & 1) == 0) && (!NAN(auStack_140b8._0_8_))) && ((uVar28 & 3) >> 1 == 0)) &&
       (auVar34._8_8_ = 0, auVar34._0_8_ = pool[lVar22 + 2], !NAN((double)pool[lVar22 + 2]))) {
      iVar25 = this->m_edgeMark;
      iVar1 = iVar25 + 1;
      this->m_edgeMark = iVar1;
      if (iVar1 != 0x7fffffff) {
        iVar25 = iVar25 + 2;
        this->m_edgeMark = iVar25;
        if (iVar25 != 0x7fffffff) {
          this_00 = (dgPolyhedra *)0x0;
          auStack_140f8 = vshufpd_avx(auVar50,auVar50,1);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = auStack_140f8._0_8_ * auStack_140b8._0_8_;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = dStack_14110;
          auVar29 = vfmadd231sd_fma(auVar37,auVar55,auVar50);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = dVar33;
          auVar29 = vfmadd132sd_fma(auVar34,auVar29,auVar2);
          auVar13._8_8_ = 0x8000000000000000;
          auVar13._0_8_ = 0x8000000000000000;
          auStack_14108 = vxorpd_avx512vl(auVar29,auVar13);
          pdVar23 = face;
          do {
            pdVar23->m_mark = iVar25;
            aHStack_14038[(long)this_00] = pdVar23->m_incidentVertex;
            if (this_00 == (dgPolyhedra *)0xfff) {
              __assert_fail("faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0]))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0xc4d,
                            "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                           );
            }
            pdVar23 = pdVar23->m_next;
            this_00 = (dgPolyhedra *)((long)&(this_00->super_dgTree<dgEdge,_long>)._vptr_dgTree + 1)
            ;
          } while (pdVar23 != face);
          dStack_14118 = dStack_14048;
          auStack_140c8 = auStack_14058;
          uVar27 = 0;
          AddFace(polyhedraOut,(HaI32)this_00,aHStack_14038,(HaI64 *)0x0);
          iStack_1414c = 1;
          local_8038[0] = face;
          iStack_1413c = 1;
          dStack_14130 = dVar33;
          dStack_14128 = auVar50._0_8_;
          do {
            pdVar23 = local_8038[(long)iStack_1414c + -1];
            apdStack_10038[(int)uVar27] = pdVar23;
            if (0xffe < (int)uVar27) {
              __assert_fail("deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0]))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0xc5a,
                            "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                           );
            }
            if (pdVar23->m_next->m_next->m_next != pdVar23) {
              __assert_fail("face->m_next->m_next->m_next == face",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0xc5b,
                            "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                           );
            }
            iStack_1414c = iStack_1414c + -1;
            uVar27 = uVar27 + 1;
            pdVar26 = pdVar23;
            do {
              face_00 = pdVar26->m_twin;
              if ((0 < face_00->m_incidentFace) && (face_00->m_mark != iVar25)) {
                uVar28 = 0;
                pdVar24 = face_00;
                do {
                  pdVar24->m_mark = iVar25;
                  aHStack_14038[uVar28] = pdVar24->m_incidentVertex;
                  if (uVar28 == 0x1000) {
                    __assert_fail("faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0]))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0xc67,
                                  "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                                 );
                  }
                  pdVar24 = pdVar24->m_next;
                  uVar28 = uVar28 + 1;
                } while (pdVar24 != face_00);
                FaceNormal((dgBigVector *)auStack_14078,this_00,face_00,pool,strideInBytes);
                dVar8 = auStack_14078._0_8_;
                auVar38._0_8_ = dVar8 * dVar8;
                dVar9 = auStack_14078._8_8_;
                auVar38._8_8_ = dVar9 * dVar9;
                auVar29 = vshufpd_avx(auVar38,auVar38,1);
                auVar39._8_8_ = 0;
                auVar39._0_8_ = dStack_14068;
                auVar29 = vfmadd231sd_fma(auVar29,auStack_14078,auStack_14078);
                auVar29 = vfmadd231sd_fma(auVar29,auVar39,auVar39);
                if (9.999999960041972e-13 <= auVar29._0_8_) {
                  auVar29 = vsqrtsd_avx(auVar29,auVar29);
                  auVar54._8_8_ = dStack_14060;
                  auVar54._0_8_ = dStack_14060;
                  auVar54._16_8_ = dStack_14060;
                  auVar54._24_8_ = dStack_14060;
                  dVar43 = 1.0 / auVar29._0_8_;
                  dVar45 = dStack_14068 * dVar43;
                  auVar46._0_8_ = dVar8 * dVar43;
                  auVar46._8_8_ = dVar9 * dVar43;
                  auVar57._8_8_ = dVar45;
                  auVar57._0_8_ = dVar45;
                  auVar57._16_8_ = dVar45;
                  auVar57._24_8_ = dVar45;
                  auVar32 = vblendpd_avx(ZEXT1632(auVar46),auVar57,4);
                  auVar32 = vblendpd_avx(auVar32,auVar54,8);
                  auVar20._8_8_ = 0x7fffffffffffffff;
                  auVar20._0_8_ = 0x7fffffffffffffff;
                  auVar20._16_8_ = 0x7fffffffffffffff;
                  auVar20._24_8_ = 0x7fffffffffffffff;
                  auVar32 = vandpd_avx512vl(auVar32,auVar20);
                  auVar21._8_8_ = 0x7fefffffffffffff;
                  auVar21._0_8_ = 0x7fefffffffffffff;
                  auVar21._16_8_ = 0x7fefffffffffffff;
                  auVar21._24_8_ = 0x7fefffffffffffff;
                  uVar10 = vpcmpgtq_avx512vl(auVar32,auVar21);
                  if ((uVar10 & 0xf) != 0) goto LAB_0085d852;
                  auVar51._0_8_ = auVar50._0_8_ * auVar46._0_8_;
                  auVar51._8_8_ = auVar50._8_8_ * auVar46._8_8_;
                  auVar29 = vshufpd_avx(auVar51,auVar51,1);
                  auVar29 = vfmadd231sd_fma(auVar29,auVar50,auVar46);
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = dVar33;
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = dVar45;
                  auVar29 = vfmadd132sd_fma(auVar44,auVar29,auVar3);
                  if (0.9998999834060669 <= auVar29._0_8_) {
                    this_00 = (dgPolyhedra *)0x7fefffffffffffff;
                    lVar22 = (long)face_00->m_prev->m_incidentVertex * (long)(strideInBytes >> 3);
                    dVar45 = (double)pool[lVar22];
                    if (0x7fefffffffffffff < (ulong)ABS(dVar45)) goto LAB_0085d893;
                    auVar29 = *(undefined1 (*) [16])(pool + lVar22 + 1);
                    auVar14._8_8_ = 0x7fffffffffffffff;
                    auVar14._0_8_ = 0x7fffffffffffffff;
                    auVar30 = vpandq_avx512vl(auVar29,auVar14);
                    auVar15._8_8_ = 0x7fefffffffffffff;
                    auVar15._0_8_ = 0x7fefffffffffffff;
                    uVar10 = vpcmpgtq_avx512vl(auVar30,auVar15);
                    if ((((uVar10 & 1) != 0) || (dVar43 = auVar29._0_8_, NAN(dVar43))) ||
                       (((uVar10 & 3) >> 1 != 0 ||
                        (auVar52._8_8_ = 0, auVar52._0_8_ = pool[lVar22 + 2],
                        NAN((double)pool[lVar22 + 2]))))) goto LAB_0085d893;
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = dStack_14128;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = dVar45;
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = dVar43 * (double)auStack_140f8._0_8_;
                    auVar30 = vfmadd231sd_fma(auVar56,auVar47,auVar4);
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = dStack_14130;
                    auVar30 = vfmadd132sd_fma(auVar52,auVar30,auVar5);
                    auVar16._8_8_ = 0x7fffffffffffffff;
                    auVar16._0_8_ = 0x7fffffffffffffff;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = auVar30._0_8_ + (double)auStack_14108._0_8_;
                    auVar30 = vandpd_avx512vl(auVar53,auVar16);
                    if (auVar30._0_8_ < 0.0078125) {
                      iStack_1413c = iStack_1413c + 1;
                      dStack_14110 = dStack_14110 + dVar45;
                      dVar45 = 1.0 / (double)iStack_1413c;
                      if (0x7fefffffffffffff < (long)ABS(dVar45 * dStack_14110)) goto LAB_0085d852;
                      auStack_140b8._8_8_ = (double)auStack_140b8._8_8_ + auVar29._8_8_;
                      auVar48._0_8_ = dVar45 * ((double)auStack_140b8._0_8_ + dVar43);
                      auVar48._8_8_ = dVar45 * (double)auStack_140b8._8_8_;
                      auVar17._8_8_ = 0x7fffffffffffffff;
                      auVar17._0_8_ = 0x7fffffffffffffff;
                      auVar29 = vandpd_avx512vl(auVar48,auVar17);
                      auStack_140b8._0_8_ = (double)auStack_140b8._0_8_ + dVar43;
                      auVar18._8_8_ = 0x7fefffffffffffff;
                      auVar18._0_8_ = 0x7fefffffffffffff;
                      uVar10 = vpcmpgtq_avx512vl(auVar29,auVar18);
                      if (((uVar10 & 1) != 0) || ((uVar10 & 3) >> 1 != 0)) goto LAB_0085d852;
                      auStack_140c8._0_8_ = dVar8 + (double)auStack_140c8._0_8_;
                      auStack_140c8._8_8_ = dVar9 + (double)auStack_140c8._8_8_;
                      dStack_14118 = dStack_14068 + dStack_14118;
                      auVar29 = vshufpd_avx(auStack_140c8,auStack_140c8,1);
                      auStack_140f8._0_8_ = auVar29._0_8_;
                      auVar40._8_8_ = 0;
                      auVar40._0_8_ = (double)auStack_140f8._0_8_ * (double)auStack_140f8._0_8_;
                      auVar29 = vfmadd231sd_fma(auVar40,auStack_140c8,auStack_140c8);
                      auVar49._8_8_ = 0;
                      auVar49._0_8_ = dStack_14118;
                      auVar29 = vfmadd231sd_fma(auVar29,auVar49,auVar49);
                      auVar29 = vsqrtsd_avx(auVar29,auVar29);
                      dStack_14130 = 1.0 / auVar29._0_8_;
                      auStack_140f8._0_8_ = (double)auStack_140f8._0_8_ * dStack_14130;
                      dStack_14128 = (double)auStack_140c8._0_8_ * dStack_14130;
                      auStack_140f8._8_8_ = 0;
                      dStack_14130 = dStack_14118 * dStack_14130;
                      if ((0x7fefffffffffffff < (long)ABS(dStack_14128)) ||
                         ((0x7fefffffffffffff < (long)ABS((double)auStack_140f8._0_8_) ||
                          (0x7fefffffffffffff < (long)ABS(dStack_14130))))) goto LAB_0085d852;
                      this_00 = (dgPolyhedra *)(uVar28 & 0xffffffff);
                      AddFace(polyhedraOut,(HaI32)uVar28,aHStack_14038,(HaI64 *)0x0);
                      local_8038[iStack_1414c] = face_00;
                      if (0xffe < iStack_1414c) {
                        __assert_fail("index < hacd::HaI32 (sizeof (stack) / sizeof (stack[0]))",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                      ,0xc86,
                                      "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                                     );
                      }
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ = dVar45 * dStack_14110;
                      iStack_1414c = iStack_1414c + 1;
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = dStack_14128;
                      auVar35._8_8_ = 0;
                      auVar35._0_8_ = auVar48._0_8_ * (double)auStack_140f8._0_8_;
                      auVar30 = vfmadd132sd_fma(auVar41,auVar35,auVar6);
                      auVar29 = vshufpd_avx(auVar48,auVar48,1);
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = dStack_14130;
                      auVar29 = vfmadd132sd_fma(auVar29,auVar30,auVar7);
                      auVar19._8_8_ = 0x8000000000000000;
                      auVar19._0_8_ = 0x8000000000000000;
                      auStack_14108 = vxorpd_avx512vl(auVar29,auVar19);
                    }
                  }
                }
                else {
                  apdStack_10038[(int)uVar27] = face_00;
                  if (0xffe < (int)uVar27) {
                    __assert_fail("deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0]))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0xc71,
                                  "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                                 );
                  }
                  uVar27 = uVar27 + 1;
                }
              }
              pdVar26 = pdVar26->m_next;
            } while (pdVar26 != pdVar23);
          } while (iStack_1414c != 0);
          EndFace(polyhedraOut);
          if ((int)uVar27 < 1) {
            return;
          }
          goto LAB_0085d800;
        }
      }
      __assert_fail("m_edgeMark < 0x7fffffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                    ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
    }
  }
LAB_0085d893:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
}

Assistant:

void dgPolyhedra::MarkAdjacentCoplanarFaces (dgPolyhedra& polyhedraOut, dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 strideInBytes)
{
	const hacd::HaF64 normalDeviation = hacd::HaF64 (0.9999f);
	const hacd::HaF64 distanceFromPlane = hacd::HaF64 (1.0f / 128.0f);

	hacd::HaI32 faceIndex[1024 * 4];
	dgEdge* stack[1024 * 4];
	dgEdge* deleteEdge[1024 * 4];

	hacd::HaI32 deleteCount = 1;
	deleteEdge[0] = face;
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

	HACD_ASSERT (face->m_incidentFace > 0);

	dgBigVector normalAverage (FaceNormal (face, pool, strideInBytes));
	hacd::HaF64 dot = normalAverage % normalAverage;
	if (dot > hacd::HaF64 (1.0e-12f)) {
		hacd::HaI32 testPointsCount = 1;
		dot = hacd::HaF64 (1.0f) / sqrt (dot);
		dgBigVector normal (normalAverage.Scale (dot));

		dgBigVector averageTestPoint (&pool[face->m_incidentVertex * stride]);
		dgBigPlane testPlane(normal, - (averageTestPoint % normal));

		polyhedraOut.BeginFace();

		IncLRU();
		hacd::HaI32 faceMark = IncLRU();

		hacd::HaI32 faceIndexCount = 0;
		dgEdge* ptr = face;
		do {
			ptr->m_mark = faceMark;
			faceIndex[faceIndexCount] = ptr->m_incidentVertex;
			faceIndexCount ++;
			HACD_ASSERT (faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0])));
			ptr = ptr ->m_next;
		} while (ptr != face);
		polyhedraOut.AddFace(faceIndexCount, faceIndex);

		hacd::HaI32 index = 1;
		deleteCount = 0;
		stack[0] = face;
		while (index) {
			index --;
			dgEdge* const face = stack[index];
			deleteEdge[deleteCount] = face;
			deleteCount ++;
			HACD_ASSERT (deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0])));
			HACD_ASSERT (face->m_next->m_next->m_next == face);

			dgEdge* edge = face;
			do {
				dgEdge* const ptr = edge->m_twin;
				if (ptr->m_incidentFace > 0) {
					if (ptr->m_mark != faceMark) {
						dgEdge* ptr1 = ptr;
						faceIndexCount = 0;
						do {
							ptr1->m_mark = faceMark;
							faceIndex[faceIndexCount] = ptr1->m_incidentVertex;
							HACD_ASSERT (faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0])));
							faceIndexCount ++;
							ptr1 = ptr1 ->m_next;
						} while (ptr1 != ptr);

						dgBigVector normal1 (FaceNormal (ptr, pool, strideInBytes));
						dot = normal1 % normal1;
						if (dot < hacd::HaF64 (1.0e-12f)) {
							deleteEdge[deleteCount] = ptr;
							deleteCount ++;
							HACD_ASSERT (deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0])));
						} else {
							//normal1 = normal1.Scale (hacd::HaF64 (1.0f) / sqrt (dot));
							dgBigVector testNormal (normal1.Scale (hacd::HaF64 (1.0f) / sqrt (dot)));
							dot = normal % testNormal;
							if (dot >= normalDeviation) {
								dgBigVector testPoint (&pool[ptr->m_prev->m_incidentVertex * stride]);
								hacd::HaF64 dist = fabs (testPlane.Evalue (testPoint));
								if (dist < distanceFromPlane) {
									testPointsCount ++;

									averageTestPoint += testPoint;
									testPoint = averageTestPoint.Scale (hacd::HaF64 (1.0f) / hacd::HaF64(testPointsCount));

									normalAverage += normal1;
									testNormal = normalAverage.Scale (hacd::HaF64 (1.0f) / sqrt (normalAverage % normalAverage));
									testPlane = dgBigPlane (testNormal, - (testPoint % testNormal));

									polyhedraOut.AddFace(faceIndexCount, faceIndex);;
									stack[index] = ptr;
									index ++;
									HACD_ASSERT (index < hacd::HaI32 (sizeof (stack) / sizeof (stack[0])));
								}
							}
						}
					}
				}

				edge = edge->m_next;
			} while (edge != face);
		}
		polyhedraOut.EndFace();
	}

	for (hacd::HaI32 index = 0; index < deleteCount; index ++) {
		DeleteFace (deleteEdge[index]);
	}
}